

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateEqualsAndHashCode
          (ImmutableMessageGenerator *this,Printer *printer)

{
  Context *pCVar1;
  Printer *pPVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  OneofDescriptor *pOVar7;
  ImmutableFieldGenerator *pIVar8;
  OneofGeneratorInfo *pOVar9;
  MessageOptions *this_00;
  int i_00;
  int i_01;
  string local_e0;
  FieldDescriptor *local_c0;
  FieldDescriptor *field_3;
  int local_b0;
  int j_1;
  int i_3;
  bool check_has_bits_1;
  FieldGeneratorInfo *info_1;
  FieldDescriptor *field_2;
  undefined1 local_90 [4];
  int i_2;
  FieldDescriptor *local_70;
  FieldDescriptor *field_1;
  int local_60;
  int j;
  int i_1;
  bool check_has_bits;
  FieldGeneratorInfo *info;
  FieldDescriptor *field;
  int i;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  ImmutableMessageGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  io::Printer::Print(printer,
                     "@java.lang.Override\npublic boolean equals(final java.lang.Object obj) {\n");
  io::Printer::Indent(local_18);
  pPVar2 = local_18;
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_38,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  io::Printer::Print(pPVar2,
                     "if (obj == this) {\n return true;\n}\nif (!(obj instanceof $classname$)) {\n  return super.equals(obj);\n}\n$classname$ other = ($classname$) obj;\n\n"
                     ,"classname",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  io::Printer::Print(local_18,"boolean result = true;\n");
  for (field._0_4_ = 0; iVar6 = (int)field,
      iVar4 = Descriptor::field_count((this->super_MessageGenerator).descriptor_), iVar6 < iVar4;
      field._0_4_ = (int)field + 1) {
    info = (FieldGeneratorInfo *)
           Descriptor::field((this->super_MessageGenerator).descriptor_,(int)field);
    pOVar7 = FieldDescriptor::containing_oneof((FieldDescriptor *)info);
    if (pOVar7 == (OneofDescriptor *)0x0) {
      _i_1 = Context::GetFieldGeneratorInfo(this->context_,(FieldDescriptor *)info);
      j._3_1_ = anon_unknown_15::CheckHasBitsForEqualsAndHashCode((FieldDescriptor *)info);
      if ((bool)j._3_1_) {
        io::Printer::Print(local_18,
                           "result = result && (has$name$() == other.has$name$());\nif (has$name$()) {\n"
                           ,"name",&_i_1->capitalized_name);
        io::Printer::Indent(local_18);
      }
      pIVar8 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                         (&this->field_generators_,(FieldDescriptor *)info);
      (*pIVar8->_vptr_ImmutableFieldGenerator[0x11])(pIVar8,local_18);
      if ((j._3_1_ & 1) != 0) {
        io::Printer::Outdent(local_18);
        io::Printer::Print(local_18,"}\n");
      }
    }
  }
  for (local_60 = 0; iVar6 = local_60,
      iVar4 = Descriptor::oneof_decl_count((this->super_MessageGenerator).descriptor_),
      pPVar2 = local_18, iVar6 < iVar4; local_60 = local_60 + 1) {
    pCVar1 = this->context_;
    pOVar7 = Descriptor::oneof_decl((this->super_MessageGenerator).descriptor_,local_60);
    pOVar9 = Context::GetOneofGeneratorInfo(pCVar1,pOVar7);
    io::Printer::Print(pPVar2,
                       "result = result && get$oneof_capitalized_name$Case().equals(\n    other.get$oneof_capitalized_name$Case());\n"
                       ,"oneof_capitalized_name",&pOVar9->capitalized_name);
    pPVar2 = local_18;
    pCVar1 = this->context_;
    pOVar7 = Descriptor::oneof_decl((this->super_MessageGenerator).descriptor_,local_60);
    pOVar9 = Context::GetOneofGeneratorInfo(pCVar1,pOVar7);
    io::Printer::Print(pPVar2,"if (!result) return false;\nswitch ($oneof_name$Case_) {\n",
                       "oneof_name",&pOVar9->name);
    io::Printer::Indent(local_18);
    field_1._4_4_ = 0;
    while( true ) {
      iVar6 = field_1._4_4_;
      pOVar7 = Descriptor::oneof_decl((this->super_MessageGenerator).descriptor_,local_60);
      iVar4 = OneofDescriptor::field_count(pOVar7);
      if (iVar4 <= iVar6) break;
      pOVar7 = Descriptor::oneof_decl((this->super_MessageGenerator).descriptor_,local_60);
      local_70 = OneofDescriptor::field(pOVar7,field_1._4_4_);
      pPVar2 = local_18;
      uVar5 = FieldDescriptor::number(local_70);
      SimpleItoa_abi_cxx11_((string *)local_90,(protobuf *)(ulong)uVar5,i_00);
      io::Printer::Print(pPVar2,"case $field_number$:\n","field_number",(string *)local_90);
      std::__cxx11::string::~string((string *)local_90);
      io::Printer::Indent(local_18);
      pIVar8 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                         (&this->field_generators_,local_70);
      (*pIVar8->_vptr_ImmutableFieldGenerator[0x11])(pIVar8,local_18);
      io::Printer::Print(local_18,"break;\n");
      io::Printer::Outdent(local_18);
      field_1._4_4_ = field_1._4_4_ + 1;
    }
    io::Printer::Print(local_18,"case 0:\ndefault:\n");
    io::Printer::Outdent(local_18);
    io::Printer::Print(local_18,"}\n");
  }
  bVar3 = PreserveUnknownFields((this->super_MessageGenerator).descriptor_);
  if (bVar3) {
    io::Printer::Print(local_18,"result = result && unknownFields.equals(other.unknownFields);\n");
  }
  iVar6 = Descriptor::extension_range_count((this->super_MessageGenerator).descriptor_);
  if (0 < iVar6) {
    io::Printer::Print(local_18,
                       "result = result &&\n    getExtensionFields().equals(other.getExtensionFields());\n"
                      );
  }
  io::Printer::Print(local_18,"return result;\n");
  io::Printer::Outdent(local_18);
  io::Printer::Print(local_18,"}\n\n");
  io::Printer::Print(local_18,"@java.lang.Override\npublic int hashCode() {\n");
  io::Printer::Indent(local_18);
  io::Printer::Print(local_18,"if (memoizedHashCode != 0) {\n");
  io::Printer::Indent(local_18);
  io::Printer::Print(local_18,"return memoizedHashCode;\n");
  io::Printer::Outdent(local_18);
  io::Printer::Print(local_18,"}\nint hash = 41;\n");
  this_00 = Descriptor::options((this->super_MessageGenerator).descriptor_);
  bVar3 = MessageOptions::no_standard_descriptor_accessor(this_00);
  if (bVar3) {
    io::Printer::Print(local_18,"hash = (19 * hash) + getDescriptorForType().hashCode();\n");
  }
  else {
    io::Printer::Print(local_18,"hash = (19 * hash) + getDescriptor().hashCode();\n");
  }
  for (field_2._4_4_ = 0; iVar6 = field_2._4_4_,
      iVar4 = Descriptor::field_count((this->super_MessageGenerator).descriptor_), iVar6 < iVar4;
      field_2._4_4_ = field_2._4_4_ + 1) {
    info_1 = (FieldGeneratorInfo *)
             Descriptor::field((this->super_MessageGenerator).descriptor_,field_2._4_4_);
    pOVar7 = FieldDescriptor::containing_oneof((FieldDescriptor *)info_1);
    if (pOVar7 == (OneofDescriptor *)0x0) {
      _i_3 = Context::GetFieldGeneratorInfo(this->context_,(FieldDescriptor *)info_1);
      j_1._3_1_ = anon_unknown_15::CheckHasBitsForEqualsAndHashCode((FieldDescriptor *)info_1);
      if ((bool)j_1._3_1_) {
        io::Printer::Print(local_18,"if (has$name$()) {\n","name",&_i_3->capitalized_name);
        io::Printer::Indent(local_18);
      }
      pIVar8 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                         (&this->field_generators_,(FieldDescriptor *)info_1);
      (*pIVar8->_vptr_ImmutableFieldGenerator[0x12])(pIVar8,local_18);
      if ((j_1._3_1_ & 1) != 0) {
        io::Printer::Outdent(local_18);
        io::Printer::Print(local_18,"}\n");
      }
    }
  }
  for (local_b0 = 0; iVar6 = local_b0,
      iVar4 = Descriptor::oneof_decl_count((this->super_MessageGenerator).descriptor_),
      pPVar2 = local_18, iVar6 < iVar4; local_b0 = local_b0 + 1) {
    pCVar1 = this->context_;
    pOVar7 = Descriptor::oneof_decl((this->super_MessageGenerator).descriptor_,local_b0);
    pOVar9 = Context::GetOneofGeneratorInfo(pCVar1,pOVar7);
    io::Printer::Print(pPVar2,"switch ($oneof_name$Case_) {\n","oneof_name",&pOVar9->name);
    io::Printer::Indent(local_18);
    field_3._4_4_ = 0;
    while( true ) {
      iVar6 = field_3._4_4_;
      pOVar7 = Descriptor::oneof_decl((this->super_MessageGenerator).descriptor_,local_b0);
      iVar4 = OneofDescriptor::field_count(pOVar7);
      if (iVar4 <= iVar6) break;
      pOVar7 = Descriptor::oneof_decl((this->super_MessageGenerator).descriptor_,local_b0);
      local_c0 = OneofDescriptor::field(pOVar7,field_3._4_4_);
      pPVar2 = local_18;
      uVar5 = FieldDescriptor::number(local_c0);
      SimpleItoa_abi_cxx11_(&local_e0,(protobuf *)(ulong)uVar5,i_01);
      io::Printer::Print(pPVar2,"case $field_number$:\n","field_number",&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      io::Printer::Indent(local_18);
      pIVar8 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                         (&this->field_generators_,local_c0);
      (*pIVar8->_vptr_ImmutableFieldGenerator[0x12])(pIVar8,local_18);
      io::Printer::Print(local_18,"break;\n");
      io::Printer::Outdent(local_18);
      field_3._4_4_ = field_3._4_4_ + 1;
    }
    io::Printer::Print(local_18,"case 0:\ndefault:\n");
    io::Printer::Outdent(local_18);
    io::Printer::Print(local_18,"}\n");
  }
  iVar6 = Descriptor::extension_range_count((this->super_MessageGenerator).descriptor_);
  if (0 < iVar6) {
    io::Printer::Print(local_18,"hash = hashFields(hash, getExtensionFields());\n");
  }
  io::Printer::Print(local_18,"hash = (29 * hash) + unknownFields.hashCode();\n");
  io::Printer::Print(local_18,"memoizedHashCode = hash;\nreturn hash;\n");
  io::Printer::Outdent(local_18);
  io::Printer::Print(local_18,"}\n\n");
  return;
}

Assistant:

void ImmutableMessageGenerator::
GenerateEqualsAndHashCode(io::Printer* printer) {
  printer->Print(
    "@java.lang.Override\n"
    "public boolean equals(final java.lang.Object obj) {\n");
  printer->Indent();
  printer->Print(
    "if (obj == this) {\n"
    " return true;\n"
    "}\n"
    "if (!(obj instanceof $classname$)) {\n"
    "  return super.equals(obj);\n"
    "}\n"
    "$classname$ other = ($classname$) obj;\n"
    "\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print("boolean result = true;\n");
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->containing_oneof() == NULL) {
      const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
      bool check_has_bits = CheckHasBitsForEqualsAndHashCode(field);
      if (check_has_bits) {
        printer->Print(
          "result = result && (has$name$() == other.has$name$());\n"
          "if (has$name$()) {\n",
          "name", info->capitalized_name);
        printer->Indent();
      }
      field_generators_.get(field).GenerateEqualsCode(printer);
      if (check_has_bits) {
        printer->Outdent();
        printer->Print(
          "}\n");
      }
    }
  }

  // Compare oneofs.
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    printer->Print(
      "result = result && get$oneof_capitalized_name$Case().equals(\n"
      "    other.get$oneof_capitalized_name$Case());\n",
      "oneof_capitalized_name",
      context_->GetOneofGeneratorInfo(
          descriptor_->oneof_decl(i))->capitalized_name);
    printer->Print(
      "if (!result) return false;\n"
      "switch ($oneof_name$Case_) {\n",
      "oneof_name",
      context_->GetOneofGeneratorInfo(
          descriptor_->oneof_decl(i))->name);
    printer->Indent();
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      printer->Print(
        "case $field_number$:\n",
        "field_number",
        SimpleItoa(field->number()));
      printer->Indent();
      field_generators_.get(field).GenerateEqualsCode(printer);
      printer->Print("break;\n");
      printer->Outdent();
    }
    printer->Print(
      "case 0:\n"
      "default:\n");
    printer->Outdent();
    printer->Print("}\n");
  }

  if (PreserveUnknownFields(descriptor_)) {
    // Always consider unknown fields for equality. This will sometimes return
    // false for non-canonical ordering when running in LITE_RUNTIME but it's
    // the best we can do.
    printer->Print(
      "result = result && unknownFields.equals(other.unknownFields);\n");
  }
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "result = result &&\n"
      "    getExtensionFields().equals(other.getExtensionFields());\n");
  }
  printer->Print(
    "return result;\n");
  printer->Outdent();
  printer->Print(
    "}\n"
    "\n");

  printer->Print(
    "@java.lang.Override\n"
    "public int hashCode() {\n");
  printer->Indent();
  printer->Print(
    "if (memoizedHashCode != 0) {\n");
  printer->Indent();
  printer->Print(
    "return memoizedHashCode;\n");
  printer->Outdent();
  printer->Print(
    "}\n"
    "int hash = 41;\n");

  // If we output a getDescriptor() method, use that as it is more efficient.
  if (descriptor_->options().no_standard_descriptor_accessor()) {
    printer->Print("hash = (19 * hash) + getDescriptorForType().hashCode();\n");
  } else {
    printer->Print("hash = (19 * hash) + getDescriptor().hashCode();\n");
  }

  // hashCode non-oneofs.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->containing_oneof() == NULL) {
      const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
      bool check_has_bits = CheckHasBitsForEqualsAndHashCode(field);
      if (check_has_bits) {
        printer->Print(
          "if (has$name$()) {\n",
          "name", info->capitalized_name);
        printer->Indent();
      }
      field_generators_.get(field).GenerateHashCode(printer);
      if (check_has_bits) {
        printer->Outdent();
        printer->Print("}\n");
      }
    }
  }

  // hashCode oneofs.
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    printer->Print(
      "switch ($oneof_name$Case_) {\n",
      "oneof_name",
      context_->GetOneofGeneratorInfo(
          descriptor_->oneof_decl(i))->name);
    printer->Indent();
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      printer->Print(
        "case $field_number$:\n",
        "field_number",
        SimpleItoa(field->number()));
      printer->Indent();
      field_generators_.get(field).GenerateHashCode(printer);
      printer->Print("break;\n");
      printer->Outdent();
    }
    printer->Print(
      "case 0:\n"
      "default:\n");
    printer->Outdent();
    printer->Print("}\n");
  }

  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "hash = hashFields(hash, getExtensionFields());\n");
  }

  printer->Print(
    "hash = (29 * hash) + unknownFields.hashCode();\n");
  printer->Print(
    "memoizedHashCode = hash;\n"
    "return hash;\n");
  printer->Outdent();
  printer->Print(
    "}\n"
    "\n");
}